

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O3

bool __thiscall
Parameter<std::pair<int,_int>_>::setData
          (Parameter<std::pair<int,_int>_> *this,vector<double,_std::allocator<double>_> *pval)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> local_28;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_28,pval);
  bVar1 = Parameter<std::pair<int,int>>::internalSetData<std::vector<double,std::allocator<double>>>
                    ((Parameter<std::pair<int,int>> *)this,&local_28);
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

virtual bool setData(std::vector<RealType> pval) {
    return internalSetData<std::vector<RealType>>(pval);
  }